

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

void Amap_LibPrintSelectedGates(Amap_Lib_t *p,int fAllGates)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  uint i;
  
  p_00 = (&p->vGates)[(ulong)(fAllGates == 0) * 2];
  for (i = 0; (int)i < p_00->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p_00,i);
    printf("%3d :%12s %d %9.2f  ",*(undefined8 *)((long)pvVar1 + 0x20),(ulong)i,
           *(undefined8 *)((long)pvVar1 + 0x10),(ulong)*(byte *)((long)pvVar1 + 0x3b));
    printf("%4s=%40s  ",*(undefined8 *)((long)pvVar1 + 0x18),*(undefined8 *)((long)pvVar1 + 0x28));
    printf("DSD: ");
    Kit_DsdPrintFromTruth(*(uint **)((long)pvVar1 + 0x30),(uint)*(byte *)((long)pvVar1 + 0x3b));
    putchar(10);
  }
  return;
}

Assistant:

void Amap_LibPrintSelectedGates( Amap_Lib_t * p, int fAllGates )
{
    Vec_Ptr_t * vArray;
    Amap_Gat_t * pGate;
    int i;
    vArray = fAllGates? p->vGates : p->vSelect;
    Vec_PtrForEachEntry( Amap_Gat_t *, vArray, pGate, i )
    {
        printf( "%3d :%12s %d %9.2f  ", i, pGate->pName, pGate->nPins, pGate->dArea );
        printf( "%4s=%40s  ", pGate->pOutName, pGate->pForm );
        printf( "DSD: " );
        Kit_DsdPrintFromTruth( pGate->pFunc, pGate->nPins );
        printf( "\n" );
    }
}